

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O1

void ssh2_sharing_queue_global_request(ConnectionLayer *cl,ssh_sharing_connstate *cs)

{
  ConnectionLayerVtable *pCVar1;
  ConnectionLayer *pCVar2;
  
  pCVar1 = (ConnectionLayerVtable *)safemalloc(1,0x18,0);
  pCVar1->rportfwd_alloc = ssh2_sharing_globreq_response;
  pCVar1->rportfwd_remove = (_func_void_ConnectionLayer_ptr_ssh_rportfwd_ptr *)cs;
  ((bufchain *)&pCVar1->lportfwd_open)->head = (bufchain_granule *)0x0;
  pCVar2 = (ConnectionLayer *)&(cl[-1].vt)->lportfwd_open;
  if (cl[-1].vt == (ConnectionLayerVtable *)0x0) {
    pCVar2 = cl + -1;
  }
  pCVar2->logctx = (LogContext *)pCVar1;
  cl[-1].vt = pCVar1;
  return;
}

Assistant:

static void ssh2_sharing_queue_global_request(
    ConnectionLayer *cl, ssh_sharing_connstate *cs)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    ssh2_queue_global_request_handler(s, ssh2_sharing_globreq_response, cs);
}